

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int stMain(int argc,char **argv)

{
  int iVar1;
  err_t code;
  int iVar2;
  char *pcVar3;
  u32 tests;
  octet crc [32];
  char local_68 [72];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  st alg\n    test cryptographic algorithms\n  st rng\n    test random number generator\n  st stamp\n    validate attached stamp\n  st crc\n    print checksum\n  st crc <prefix>\n    print checksum calculated using <prefix>\n"
           ,"st","self-testing");
    return -1;
  }
  iVar1 = strCmp(argv[1],"alg");
  iVar2 = -1;
  if (iVar1 == 0) {
    code = 0x25b;
    if (argc != 2) goto LAB_0010c3d1;
    tests = 0x1f;
LAB_0010c357:
    code = cmdStDo(tests);
  }
  else {
    iVar1 = strCmp(argv[1],"rng");
    if (iVar1 == 0) {
      code = 0x25b;
      if ((argc != 2) || (code = cmdStDo(0x10), code != 0)) goto LAB_0010c3d1;
      code = cmdRngStart(1);
    }
    else {
      iVar1 = strCmp(argv[1],"stamp");
      if (iVar1 == 0) {
        code = 0x25b;
        if ((argc != 2) || (code = cmdStDo(1), code != 0)) goto LAB_0010c3d1;
        tests = 0x2000000;
        goto LAB_0010c357;
      }
      iVar1 = strCmp(argv[1],"crc");
      code = 0x259;
      if (iVar1 != 0) goto LAB_0010c3d1;
      code = 0x25b;
      if ((argc - 2U < 2) && (code = cmdStDo(4), code == 0)) {
        if (argc == 2) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = argv[2];
        }
        code = cmdStCrc(crc,pcVar3);
        if (code == 0) {
          hexFrom(local_68,crc,0x20);
          hexLower(local_68);
          iVar1 = printf("%s\n",local_68);
          code = iVar1 >> 0x1f & 0x65;
        }
      }
    }
  }
  if (code == 0) {
    iVar2 = strCmp(argv[1],"alg");
    if (iVar2 == 0) {
      iVar2 = 0;
      code = 0;
    }
    else {
      iVar1 = strCmp(argv[1],"stamp");
      iVar2 = 0;
      code = 0;
      if (iVar1 != 0) {
        return 0;
      }
    }
  }
LAB_0010c3d1:
  pcVar3 = errMsg(code);
  printf("bee2cmd/%s: %s\n","st",pcVar3);
  return iVar2;
}

Assistant:

int stMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return stUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "alg"))
		code = stAlg(argc - 1, argv + 1);
	else if (strEq(argv[0], "rng"))
		code = stRng(argc - 1, argv + 1);
	else if (strEq(argv[0], "stamp"))
		code = stStamp(argc - 1, argv + 1);
	else if (strEq(argv[0], "crc"))
		code = stCrc(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "alg") || strEq(argv[0], "stamp"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}